

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

string * __thiscall
units::probeUnit_abi_cxx11_
          (string *__return_storage_ptr__,units *this,precise_unit *un,
          pair<units::precise_unit,_const_char_*> *probe)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  precise_unit pVar1;
  unit in_stack_ffffffffffffff18;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  precise_unit local_b8;
  string fnd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pVar1 = precise_unit::operator*((precise_unit *)this,un);
  local_b8._8_8_ = pVar1._8_8_;
  local_b8.multiplier_ = pVar1.multiplier_;
  find_unit_abi_cxx11_(in_stack_ffffffffffffff18);
  if (fnd._M_string_length == 0) {
    precise_unit::inv(&local_b8);
    find_unit_abi_cxx11_(in_stack_ffffffffffffff18);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&fnd,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    if (fnd._M_string_length == 0) {
      pVar1 = precise_unit::operator/((precise_unit *)this,un);
      local_b8._8_8_ = pVar1._8_8_;
      local_b8.multiplier_ = pVar1.multiplier_;
      find_unit_abi_cxx11_(in_stack_ffffffffffffff18);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&fnd,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8
                );
      std::__cxx11::string::~string((string *)&local_d8);
      if (fnd._M_string_length != 0) {
        std::operator+(&local_d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fnd,'*'
                      );
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_d8,(char *)un[1].multiplier_);
        goto LAB_003613f7;
      }
      precise_unit::inv(&local_b8);
      find_unit_abi_cxx11_(in_stack_ffffffffffffff18);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&fnd,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8
                );
      std::__cxx11::string::~string((string *)&local_d8);
      if (fnd._M_string_length == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        goto LAB_003614e6;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,(char *)un[1].multiplier_,(allocator<char> *)&local_68);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                     &local_88,'/');
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                     &fnd);
      std::__cxx11::string::~string((string *)&local_d8);
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"1/(",&local_d9);
      std::operator+(&local_68,&local_48,&fnd);
      std::operator+(&local_88,&local_68,'*');
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                     &local_88,(char *)un[1].multiplier_);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                     ')');
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
    }
  }
  else {
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fnd,'/');
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                   (char *)un[1].multiplier_);
LAB_003613f7:
    this_00 = &local_d8;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_003614e6:
  std::__cxx11::string::~string((string *)&fnd);
  return __return_storage_ptr__;
}

Assistant:

static std::string probeUnit(
    const precise_unit& un,
    const std::pair<precise_unit, const char*>& probe)
{
    // let's try common divisor units
    auto ext = un * probe.first;
    auto fnd = find_unit(unit_cast(ext));
    if (!fnd.empty()) {
        return fnd + '/' + probe.second;
    }
    // let's try inverse of common multiplier units
    fnd = find_unit(unit_cast(ext.inv()));
    if (!fnd.empty()) {
        return std::string("1/(") + fnd + '*' + probe.second + ')';
    }

    // let's try common multiplier units
    ext = un / probe.first;
    fnd = find_unit(unit_cast(ext));
    if (!fnd.empty()) {
        return fnd + '*' + probe.second;
    }
    // let's try common divisor with inv units
    fnd = find_unit(unit_cast(ext.inv()));
    if (!fnd.empty()) {
        return std::string(probe.second) + '/' + fnd;
    }
    return std::string{};
}